

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irStatement * build_ir_ifstmt(Context_conflict *ctx,MOJOSHADER_astIfStatement *ast)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MOJOSHADER_astExpression *_ast;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *pMVar12;
  MOJOSHADER_irStatement *next;
  Context_conflict *pCVar13;
  
  _ast = ast->expr;
  if (_ast->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x133f,
                  "MOJOSHADER_irStatement *build_ir_ifstmt(Context *, const MOJOSHADER_astIfStatement *)"
                 );
  }
  iVar3 = ctx->ir_label_count;
  iVar1 = iVar3 + 1;
  iVar2 = iVar3 + 2;
  if (ast->else_statement == (MOJOSHADER_astStatement *)0x0) {
    ctx->ir_label_count = iVar2;
    pMVar4 = (MOJOSHADER_irExpression *)build_ir(ctx,_ast);
    if (pMVar4 != (MOJOSHADER_irExpression *)0x0) {
      if ((pMVar4->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) goto LAB_00147bfc;
      if (MOJOSHADER_IR_CONSTRUCT < (pMVar4->ir).type) goto LAB_00147c1b;
    }
    pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_irExpression *)0x0;
      pCVar13 = ctx;
    }
    else {
      (pMVar5->ir).type = MOJOSHADER_IR_CONSTANT;
      (pMVar5->ir).filename = ctx->sourcefile;
      (pMVar5->ir).line = ctx->sourceline;
      *(MOJOSHADER_astDataTypeType *)((long)pMVar5 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
      *(int *)((long)pMVar5 + 0x1c) = 1;
      pCVar13 = (Context_conflict *)&(pMVar5->temp).index;
    }
    pCVar13->isfail = 1;
    pMVar6 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
    if (pMVar6 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar6 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar6->ir).type = MOJOSHADER_IR_CJUMP;
      (pMVar6->ir).filename = ctx->sourcefile;
      (pMVar6->ir).line = ctx->sourceline;
      (pMVar6->jump).label = 0;
      (pMVar6->move).src = pMVar4;
      (pMVar6->cjump).right = pMVar5;
      (pMVar6->cjump).iftrue = iVar3;
      (pMVar6->cjump).iffalse = iVar1;
    }
    pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar7 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar7->ir).type = MOJOSHADER_IR_LABEL;
      (pMVar7->ir).filename = ctx->sourcefile;
      (pMVar7->ir).line = ctx->sourceline;
      (pMVar7->jump).label = iVar3;
    }
    pMVar8 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->statement);
    if (pMVar8 != (MOJOSHADER_irStatement *)0x0) {
      if ((pMVar8->ir).type < MOJOSHADER_IR_MOVE) goto LAB_00147b9f;
      if (MOJOSHADER_IR_DISCARD < (pMVar8->ir).type) goto LAB_00147bbe;
    }
    pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar9 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar9->ir).type = MOJOSHADER_IR_LABEL;
      (pMVar9->ir).filename = ctx->sourcefile;
      (pMVar9->ir).line = ctx->sourceline;
      (pMVar9->jump).label = iVar1;
    }
    pMVar10 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->next);
    if (pMVar10 != (MOJOSHADER_irStatement *)0x0) {
      if ((pMVar10->ir).type < MOJOSHADER_IR_MOVE) goto LAB_00147b9f;
      if (MOJOSHADER_IR_DISCARD < (pMVar10->ir).type) goto LAB_00147bbe;
    }
    pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
    pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
  }
  else {
    ctx->ir_label_count = iVar3 + 3;
    pMVar4 = (MOJOSHADER_irExpression *)build_ir(ctx,_ast);
    if (pMVar4 != (MOJOSHADER_irExpression *)0x0) {
      if ((pMVar4->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
LAB_00147bfc:
        __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
      }
      if (MOJOSHADER_IR_CONSTRUCT < (pMVar4->ir).type) {
LAB_00147c1b:
        __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
      }
    }
    pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_irExpression *)0x0;
      pCVar13 = ctx;
    }
    else {
      (pMVar5->ir).type = MOJOSHADER_IR_CONSTANT;
      (pMVar5->ir).filename = ctx->sourcefile;
      (pMVar5->ir).line = ctx->sourceline;
      *(MOJOSHADER_astDataTypeType *)((long)pMVar5 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
      *(int *)((long)pMVar5 + 0x1c) = 1;
      pCVar13 = (Context_conflict *)&(pMVar5->temp).index;
    }
    pCVar13->isfail = 1;
    pMVar6 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
    if (pMVar6 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar6 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar6->ir).type = MOJOSHADER_IR_CJUMP;
      (pMVar6->ir).filename = ctx->sourcefile;
      (pMVar6->ir).line = ctx->sourceline;
      (pMVar6->jump).label = 0;
      (pMVar6->move).src = pMVar4;
      (pMVar6->cjump).right = pMVar5;
      (pMVar6->cjump).iftrue = iVar3;
      (pMVar6->cjump).iffalse = iVar1;
    }
    pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar7 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar7->ir).type = MOJOSHADER_IR_LABEL;
      (pMVar7->ir).filename = ctx->sourcefile;
      (pMVar7->ir).line = ctx->sourceline;
      (pMVar7->jump).label = iVar3;
    }
    pMVar8 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->statement);
    if (pMVar8 != (MOJOSHADER_irStatement *)0x0) {
      if ((pMVar8->ir).type < MOJOSHADER_IR_MOVE) goto LAB_00147b9f;
      if (MOJOSHADER_IR_DISCARD < (pMVar8->ir).type) goto LAB_00147bbe;
    }
    pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar9 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar9->ir).type = MOJOSHADER_IR_JUMP;
      (pMVar9->ir).filename = ctx->sourcefile;
      (pMVar9->ir).line = ctx->sourceline;
      (pMVar9->jump).label = iVar2;
    }
    pMVar10 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar10 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar10 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar10->ir).type = MOJOSHADER_IR_LABEL;
      (pMVar10->ir).filename = ctx->sourcefile;
      (pMVar10->ir).line = ctx->sourceline;
      (pMVar10->jump).label = iVar1;
    }
    pMVar11 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->else_statement);
    if (pMVar11 != (MOJOSHADER_irStatement *)0x0) {
      if ((pMVar11->ir).type < MOJOSHADER_IR_MOVE) goto LAB_00147b9f;
      if (MOJOSHADER_IR_DISCARD < (pMVar11->ir).type) goto LAB_00147bbe;
    }
    pMVar12 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar12 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar12 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      (pMVar12->ir).type = MOJOSHADER_IR_LABEL;
      (pMVar12->ir).filename = ctx->sourcefile;
      (pMVar12->ir).line = ctx->sourceline;
      (pMVar12->jump).label = iVar2;
    }
    next = (MOJOSHADER_irStatement *)build_ir_internal(ctx,ast->next);
    if (next != (MOJOSHADER_irStatement *)0x0) {
      if ((next->ir).type < MOJOSHADER_IR_MOVE) {
LAB_00147b9f:
        __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_STMT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x11f4,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
      }
      if (MOJOSHADER_IR_DISCARD < (next->ir).type) {
LAB_00147bbe:
        __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_STMT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x11f5,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
      }
    }
    pMVar12 = new_ir_seq(ctx,pMVar12,next);
    pMVar11 = new_ir_seq(ctx,pMVar11,pMVar12);
    pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
    pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
    pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
  }
  pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
  pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
  return pMVar6;
}

Assistant:

static MOJOSHADER_irStatement *build_ir_ifstmt(Context *ctx,
                                          const MOJOSHADER_astIfStatement *ast)
{
    assert(ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    // !!! FIXME: ast->attributes?

    // IF statement without an ELSE.
    if (ast->else_statement == NULL)
    {
        /* The gist...
                cjump expr, t, join
            t:
                statement
            join:
        */

        const int t = generate_ir_label(ctx);
        const int join = generate_ir_label(ctx);

        return new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), t, join),
               new_ir_seq(ctx, new_ir_label(ctx, t),
               new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
               new_ir_seq(ctx, new_ir_label(ctx, join),
                               build_ir_stmt(ctx, ast->next)))));
    } // if

    // IF statement _with_ an ELSE.
    /* The gist...
            cjump expr, t, f
        t:
            statement
            jump join
        f:
            elsestatement
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);

    return new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), t, f),
           new_ir_seq(ctx, new_ir_label(ctx, t),
           new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
           new_ir_seq(ctx, new_ir_jump(ctx, join),
           new_ir_seq(ctx, new_ir_label(ctx, f),
           new_ir_seq(ctx, build_ir_stmt(ctx, ast->else_statement),
           new_ir_seq(ctx, new_ir_label(ctx, join),
                           build_ir_stmt(ctx, ast->next))))))));
}